

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O2

logical pnga_destroy_mutexes(void)

{
  int iVar1;
  ulong uVar2;
  
  _ga_sync_begin = 1;
  _ga_sync_end = _ga_sync_begin;
  if (num_mutexes < 1) {
    pnga_error("mutexes destroyed",0);
  }
  num_mutexes = 0;
  if (GAnproc == 1) {
    uVar2 = 1;
  }
  else {
    iVar1 = ARMCI_Destroy_mutexes();
    uVar2 = (ulong)(iVar1 == 0);
  }
  return uVar2;
}

Assistant:

logical pnga_destroy_mutexes()
{
   _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
   if(num_mutexes<1) pnga_error("mutexes destroyed",0);

   num_mutexes= 0;
   if(GAnproc == 1){
      return TRUE;
   }
   if(ARMCI_Destroy_mutexes()){
      return FALSE;
   }
   return TRUE;
}